

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::FinishWrapperObjectTracing(Recycler *this)

{
  DOMWrapperTracingCallback p_Var1;
  DOMWrapperTracingDoneCallback p_Var2;
  bool bVar3;
  
  do {
    p_Var1 = this->collectionWrapper->wrapperTracingCallback;
    if (p_Var1 != (DOMWrapperTracingCallback)0x0) {
      (*p_Var1)(this->collectionWrapper->wrapperTracingCallbackState);
    }
    ProcessMark(this,false);
    p_Var2 = this->collectionWrapper->wrapperTracingDoneCallback;
    if (p_Var2 == (DOMWrapperTracingDoneCallback)0x0) break;
    bVar3 = (*p_Var2)(this->collectionWrapper->wrapperTracingCallbackState);
  } while (!bVar3);
  p_Var1 = this->collectionWrapper->wrapperTracingCallback;
  if (p_Var1 != (DOMWrapperTracingCallback)0x0) {
    (*p_Var1)(this->collectionWrapper->wrapperTracingCallbackState);
  }
  this->needExternalWrapperTracing = false;
  return;
}

Assistant:

void
Recycler::FinishWrapperObjectTracing()
{
    //TODO:akatti:Add ETW event for this.
    // Tracing would have generated more work for mark and marking might generate more work for tracing.
    // We continue until we find no more pending tracing work.
    do
    {
        this->collectionWrapper->EndMarkDomWrapperTracingCallback();
        this->ProcessMark(false);
    } while (!this->collectionWrapper->EndMarkDomWrapperTracingDoneCallback());

    // This is just to wait until tracing has finished.
    this->collectionWrapper->EndMarkDomWrapperTracingCallback();
    this->ClearNeedExternalWrapperTracing();
}